

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

size_t atohex(uchar *b,size_t bsize,char *p,size_t psize)

{
  char cVar1;
  bool bVar2;
  byte bVar3;
  long lVar4;
  char cVar5;
  
  lVar4 = 0x14;
  do {
    if ((lVar4 == 0) || (p < (char *)0x2)) {
      return 0x14 - lVar4;
    }
    cVar1 = *(char *)bsize;
    if (((byte)(cVar1 + 0x9fU) < 0x1a) || ((byte)(cVar1 + 0xbfU) < 0x1a)) {
      bVar3 = cVar1 * '\x10' + 0x90;
LAB_00152918:
      cVar1 = *(char *)(bsize + 1);
      cVar5 = -0x57;
      if (((0x19 < (byte)(cVar1 + 0x9fU)) && (cVar5 = -0x37, 0x19 < (byte)(cVar1 + 0xbfU))) &&
         (cVar5 = -0x30, 9 < (byte)(cVar1 - 0x30U))) goto LAB_0015296d;
      *b = cVar1 + cVar5 | bVar3;
      b = b + 1;
      lVar4 = lVar4 + -1;
      bsize = bsize + 2;
      p = p + -2;
      bVar2 = true;
    }
    else {
      if ((byte)(cVar1 - 0x30U) < 10) {
        bVar3 = cVar1 << 4;
        goto LAB_00152918;
      }
LAB_0015296d:
      bVar2 = false;
    }
    if (!bVar2) {
      return 0xffffffffffffffff;
    }
  } while( true );
}

Assistant:

static size_t
atohex(unsigned char *b, size_t bsize, const char *p, size_t psize)
{
	size_t fbsize = bsize;

	while (bsize && psize > 1) {
		unsigned char x;

		if (p[0] >= 'a' && p[0] <= 'z')
			x = (p[0] - 'a' + 0x0a) << 4;
		else if (p[0] >= 'A' && p[0] <= 'Z')
			x = (p[0] - 'A' + 0x0a) << 4;
		else if (p[0] >= '0' && p[0] <= '9')
			x = (p[0] - '0') << 4;
		else
			return (-1);
		if (p[1] >= 'a' && p[1] <= 'z')
			x |= p[1] - 'a' + 0x0a;
		else if (p[1] >= 'A' && p[1] <= 'Z')
			x |= p[1] - 'A' + 0x0a;
		else if (p[1] >= '0' && p[1] <= '9')
			x |= p[1] - '0';
		else
			return (-1);

		*b++ = x;
		bsize--;
		p += 2;
		psize -= 2;
	}
	return (fbsize - bsize);
}